

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O2

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  SidAddress *sidAddress;
  long lVar1;
  Animatable *pAVar2;
  DocumentProcessor *pDVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  UniqueId *uniqueId;
  Formula *__from_00;
  undefined4 extraout_var;
  undefined8 *puVar7;
  undefined4 extraout_var_00;
  VariableExpression *pVVar8;
  FragmentExpression *this_00;
  SidTreeNode *pSVar9;
  undefined4 extraout_var_01;
  KinematicInstance *pKVar10;
  char *in_RCX;
  String *pSVar11;
  String *name;
  long lVar12;
  bool fragmentSuccess;
  FragmentExpression *local_f0;
  char *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  String local_c0;
  char *local_a0;
  long local_98;
  String local_90;
  String local_70;
  String local_50;
  
  if ((*(long *)(__to + 0x18) == 0) || (*(long *)(__to + 0x30) != *(long *)(__to + 0x38))) {
    pSVar11 = (String *)0x0;
  }
  else {
    pSVar11 = (String *)0x0;
    if (*(int *)(__to + 0x48) == 0) {
      pSVar11 = (String *)(__to + 0x10);
    }
  }
  sidAddress = (SidAddress *)(__to + 8);
  if (*(int *)(__to + 0xc0) == 1) {
    local_e8 = in_RCX;
    local_a0 = __from;
    uniqueId = COLLADACsymbol::getFormulaUniqueId((COLLADACsymbol *)__to);
    __from_00 = DocumentProcessor::getFormulaByUniqueId(this->mDocumentProcessor,uniqueId);
    if (__from_00 == (Formula *)0x0) {
      this_00 = (FragmentExpression *)operator_new(200);
      SidAddress::getSidAddressString_abi_cxx11_((String *)&fragmentSuccess,sidAddress);
      MathML::AST::FragmentExpression::FragmentExpression
                (this_00,(String *)&fragmentSuccess,CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
      std::__cxx11::string::~string((string *)&fragmentSuccess);
      COLLADAFW::UniqueId::toAscii_abi_cxx11_(&local_c0,uniqueId);
      std::operator+(&local_e0,"Formula with unique id\"",&local_c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fragmentSuccess,&local_e0,"\" ");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::append(&fragmentSuccess);
      pDVar3 = this->mDocumentProcessor;
      std::__cxx11::string::string((string *)&local_70,(string *)&fragmentSuccess);
      bVar4 = IFilePartLoader::handleFWLError
                        (&pDVar3->super_IFilePartLoader,ERROR_UNRESOLVED_FORMULA,&local_70,
                         SEVERITY_ERROR_NONCRITICAL);
      *local_e8 = bVar4;
      pSVar11 = &local_70;
    }
    else {
      name = &__from_00->mName;
      if (pSVar11 != (String *)0x0) {
        name = pSVar11;
      }
      local_f0 = (FragmentExpression *)operator_new(200);
      MathML::AST::FragmentExpression::FragmentExpression
                (local_f0,name,CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
      if ((__from_00->mMathmlAsts).mCount == 1) {
        fragmentSuccess = true;
        iVar6 = link(this,(char *)__from_00,(char *)*(__from_00->mMathmlAsts).mData);
        *(__from_00->mMathmlAsts).mData = (INode *)CONCAT44(extraout_var,iVar6);
        (*(local_f0->super_INode)._vptr_INode[7])(local_f0,*(__from_00->mMathmlAsts).mData);
        if (fragmentSuccess == false) {
          return 0;
        }
      }
      local_98 = *(long *)(__to + 200);
      puVar7 = *(undefined8 **)(__to + 0xd0);
      if ((long)puVar7 - local_98 >> 3 ==
          (__from_00->mNewParams).super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mCount) {
        for (lVar12 = 0; (undefined8 *)(local_98 + lVar12) != puVar7; lVar12 = lVar12 + 8) {
          lVar1 = *(long *)((long)(__from_00->mNewParams).
                                  super_ArrayPrimitiveType<COLLADAFW::FormulaNewParam_*>.mData +
                           lVar12);
          iVar6 = link(this,local_a0,*(char **)(local_98 + lVar12));
          (*(local_f0->super_INode)._vptr_INode[0xe])
                    (local_f0,lVar1 + 0x18,CONCAT44(extraout_var_00,iVar6));
          if (*local_e8 != '\x01') break;
          puVar7 = *(undefined8 **)(__to + 0xd0);
        }
        return (int)local_f0;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fragmentSuccess,"Number of newparams in formula \"",name);
      this_00 = local_f0;
      if (*(long *)(local_a0 + 0x90) != 0) {
        std::operator+(&local_c0,"referenced in \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_a0 + 0x88));
        std::operator+(&local_e0,&local_c0,"\" ");
        std::__cxx11::string::append((string *)&fragmentSuccess);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::__cxx11::string::append(&fragmentSuccess);
      pDVar3 = this->mDocumentProcessor;
      std::__cxx11::string::string((string *)&local_50,(string *)&fragmentSuccess);
      bVar4 = IFilePartLoader::handleFWLError
                        (&pDVar3->super_IFilePartLoader,ERROR_PARAMETER_COUNT_DOESNOT_MATCH,
                         &local_50,SEVERITY_ERROR_NONCRITICAL);
      *local_e8 = bVar4;
      pSVar11 = &local_50;
    }
    std::__cxx11::string::~string((string *)pSVar11);
    std::__cxx11::string::~string((string *)&fragmentSuccess);
    return (int)this_00;
  }
  if (pSVar11 != (String *)0x0) {
    fragmentSuccess = false;
    getNewParamIndex(this,(Formula *)__from,pSVar11,&fragmentSuccess);
    if (fragmentSuccess == true) {
      pVVar8 = (VariableExpression *)operator_new(0x30);
      MathML::AST::VariableExpression::VariableExpression(pVVar8,pSVar11);
      *in_RCX = '\x01';
      return (int)pVVar8;
    }
  }
  pSVar9 = DocumentProcessor::resolveSid(this->mDocumentProcessor,sidAddress);
  if (pSVar9 == (SidTreeNode *)0x0) {
    SidAddress::getSidAddressString_abi_cxx11_(&local_c0,sidAddress);
    std::operator+(&local_e0,"Parameter with sid address \"",&local_c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentSuccess,&local_e0,"\" ");
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (*(long *)(__from + 0x90) != 0) {
      std::operator+(&local_c0,"referenced in \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (__from + 0x88));
      std::operator+(&local_e0,&local_c0,"\" ");
      std::__cxx11::string::append((string *)&fragmentSuccess);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::__cxx11::string::append(&fragmentSuccess);
    pDVar3 = this->mDocumentProcessor;
    std::__cxx11::string::string((string *)&local_90,(string *)&fragmentSuccess);
    bVar4 = IFilePartLoader::handleFWLError
                      (&pDVar3->super_IFilePartLoader,ERROR_UNRESOLVED_PARAMETER,&local_90,
                       SEVERITY_ERROR_NONCRITICAL);
    *in_RCX = bVar4;
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&fragmentSuccess);
    cVar5 = '\x01';
LAB_007d6022:
    iVar6 = 0;
  }
  else {
    if (pSVar9->mTargetType == TARGETTYPECLASS_INTERMEDIATETARGETABLE) {
      pKVar10 = intermediateTargetableSafeCast<COLLADASaxFWL::KinematicInstance>
                          ((pSVar9->mTarget).intermediateTargetable);
      pVVar8 = (VariableExpression *)operator_new(0x30);
      COLLADAFW::UniqueId::toAscii_abi_cxx11_
                ((String *)&fragmentSuccess,&pKVar10->mReplacingObjectUniqueId);
      MathML::AST::VariableExpression::VariableExpression(pVVar8,(String *)&fragmentSuccess);
    }
    else {
      if (pSVar9->mTargetType != TARGETTYPECLASS_OBJECT) {
        cVar5 = '\0';
        goto LAB_007d6022;
      }
      pAVar2 = (pSVar9->mTarget).animatable;
      pVVar8 = (VariableExpression *)operator_new(0x30);
      iVar6 = (*pAVar2->_vptr_Animatable[3])(pAVar2);
      COLLADAFW::UniqueId::toAscii_abi_cxx11_
                ((String *)&fragmentSuccess,(UniqueId *)CONCAT44(extraout_var_01,iVar6));
      MathML::AST::VariableExpression::VariableExpression(pVVar8,(String *)&fragmentSuccess);
    }
    iVar6 = (int)pVVar8;
    std::__cxx11::string::~string((string *)&fragmentSuccess);
    cVar5 = '\x01';
  }
  *in_RCX = cVar5;
  return iVar6;
}

Assistant:

MathML::AST::INode* FormulasLinker::link( COLLADAFW::Formula* formula, COLLADACsymbol* csymbol, bool& success)
	{
		const SidAddress& targetAddress = csymbol->getSidAddress();

		const String* csymbolName = 0;
		// if the address consist of a single word, this is considered to be the csymbol name.
		if ( !targetAddress.getId().empty() && 
			targetAddress.getSids().empty() && 
			targetAddress.getMemberSelection() == SidAddress::MEMBER_SELECTION_NONE )
		{
			csymbolName = &targetAddress.getId();
		}

		if ( csymbol->getCSymbolType() == COLLADACsymbol::FUNCTION )
		{
			const COLLADAFW::UniqueId& formulaUniqueId = csymbol->getFormulaUniqueId();

			COLLADAFW::Formula* targetFormula = mDocumentProcessor->getFormulaByUniqueId(formulaUniqueId);
		
			MathML::AST::FragmentExpression* fragmentExpression = 0;

			if ( targetFormula )
			{
				// find a suitable name for the fragment expression
				// if possible use the string in the csymbol element, otherwise the name of the referenced fromula
				const String* fragmentExpressionName = 0;
				fragmentExpressionName = csymbolName ? csymbolName : &targetFormula->getName();

				fragmentExpression = new MathML::AST::FragmentExpression(*fragmentExpressionName, MathML::AST::INode::CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);
				COLLADAFW::MathmlAstArray& asts = targetFormula->getMathmlAsts();
				if ( asts.getCount() == 1)
				{
					// we have to ensure, that the fragment won't change anymore. Therefore we need to link immediately
					bool fragmentSuccess = true;
					asts[0] = link( targetFormula, asts[0], fragmentSuccess);
					fragmentExpression->setFragment( asts[0] );
					if ( !fragmentSuccess )
					{
						return 0;
					}
				}
				const COLLADACsymbol::ParameterList& parameters =  csymbol->getParameterList();
				const COLLADAFW::FormulaNewParamPointerArray& targetFormulaParameters = targetFormula->getNewParams();
				if ( parameters.size() != targetFormulaParameters.getCount() )
				{
					String msg = "Number of newparams in formula \"" + *fragmentExpressionName;
					const String& formulaName = formula->getName();
					if ( !formulaName.empty() )
					{
						msg.append( "referenced in \"" + formulaName + "\" ");
					}
					msg.append( "does not match parameters count." );

					success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_PARAMETER_COUNT_DOESNOT_MATCH, msg);
				}
				else
				{
					COLLADACsymbol::ParameterList::const_iterator it = parameters.begin();
					for ( size_t i = 0; it!=parameters.end(); ++it, ++i )
					{
						const COLLADAFW::FormulaNewParam* parameter = targetFormulaParameters[i];
						fragmentExpression->addParameter(parameter->getName(), link( formula, *it, success));
						if ( !success )
						{
							break;
						}
					}
				}
			}
			else
			{
				// formula not found
				fragmentExpression = new MathML::AST::FragmentExpression(targetAddress.getSidAddressString(), MathML::AST::INode::CLONEFLAG_DEEPCOPY_FRAGMENT_PARAMS);

				String msg = "Formula with unique id\"" + formulaUniqueId.toAscii() + "\" ";
				msg.append( "could not be found." );

				success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_UNRESOLVED_FORMULA, msg);
			}
			return fragmentExpression;
		}
		else
		{
			MathML::AST::VariableExpression* variableExpression = 0;

			// the csymbol is a parameter. 
			// if the address consist of a single word, it might be a parameter of the formula itself.
			if ( csymbolName )
			{
				//search for the parameter name in the formulas new params
				bool found = false;
				getNewParamIndex(formula, *csymbolName, found);
				if ( found )
				{
					// we are done. create new VariableExpression and return
					variableExpression = FW_NEW MathML::AST::VariableExpression(*csymbolName);
					success = true;
					return variableExpression;
				}
			}

			// Try to find the referenced parameter in the entire COLLADA file, using ordinary sid address
			// syntax
			const SidTreeNode* targetSidTreeNode = mDocumentProcessor->resolveSid( targetAddress );

			if ( !targetSidTreeNode )
			{
				// parameter not found
				String msg = "Parameter with sid address \"" + targetAddress.getSidAddressString() + "\" ";
				const String& formulaName = formula->getName();
				if ( !formulaName.empty() )
				{
					msg.append( "referenced in \"" + formulaName + "\" ");
				}
				msg.append( "could not be resolved." );

				success = mDocumentProcessor->handleFWLError(SaxFWLError::ERROR_UNRESOLVED_PARAMETER, msg);
			}
			else
			{
				// parameter found
				if (targetSidTreeNode->getTargetType() == SidTreeNode::TARGETTYPECLASS_OBJECT)
				{
					// the parameter is an object, e.g. a joint
					const COLLADAFW::Object* object = targetSidTreeNode->getObjectTarget();
					COLLADABU_ASSERT(object);
					variableExpression = new MathML::AST::VariableExpression(object->getUniqueId().toAscii());
				}
				else if (targetSidTreeNode->getTargetType() == SidTreeNode::TARGETTYPECLASS_INTERMEDIATETARGETABLE)
				{
					// the parameter is an object, e.g. a joint
					const IntermediateTargetable* intermediateTargetable = targetSidTreeNode->getIntermediateTargetableTarget();
					COLLADABU_ASSERT(intermediateTargetable);
					const KinematicInstance* kinematicInstance = intermediateTargetableSafeCast<KinematicInstance>(intermediateTargetable);
					// for now we only support kinematic instances here
					COLLADABU_ASSERT(kinematicInstance);
					variableExpression = new MathML::AST::VariableExpression(kinematicInstance->getReplacingObjectUniqueId().toAscii());
				}
				else
				{
					// TODO: animatabel not supported yet
					success = false;
					return 0;
				}

			}
			success = true;
			return variableExpression;
		}

		success = false;
		return 0;
	}